

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O1

size_t duckdb_zstd::FSE_buildCTable_rle(FSE_CTable *ct,BYTE symbolValue)

{
  undefined3 in_register_00000031;
  
  *(undefined2 *)ct = 0;
  *(short *)((long)ct + 2) = (short)CONCAT31(in_register_00000031,symbolValue);
  ct[1] = 0;
  (ct + (ulong)CONCAT31(in_register_00000031,symbolValue) * 2 + 2)[0] = 0;
  (ct + (ulong)CONCAT31(in_register_00000031,symbolValue) * 2 + 2)[1] = 0;
  return 0;
}

Assistant:

size_t FSE_buildCTable_rle (FSE_CTable* ct, BYTE symbolValue)
{
    void* ptr = ct;
    U16* tableU16 = ( (U16*) ptr) + 2;
    void* FSCTptr = (U32*)ptr + 2;
    FSE_symbolCompressionTransform* symbolTT = (FSE_symbolCompressionTransform*) FSCTptr;

    /* header */
    tableU16[-2] = (U16) 0;
    tableU16[-1] = (U16) symbolValue;

    /* Build table */
    tableU16[0] = 0;
    tableU16[1] = 0;   /* just in case */

    /* Build Symbol Transformation Table */
    symbolTT[symbolValue].deltaNbBits = 0;
    symbolTT[symbolValue].deltaFindState = 0;

    return 0;
}